

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O2

void __thiscall Catch::JsonReporter::endListing(JsonReporter *this)

{
  if (this->m_startedListing == true) {
    endObject(this);
  }
  this->m_startedListing = false;
  return;
}

Assistant:

void JsonReporter::endListing() {
        if ( m_startedListing ) { endObject(); }
        m_startedListing = false;
    }